

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall wabt::FuncType::~FuncType(FuncType *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pTVar2;
  pointer pcVar3;
  
  (this->super_TypeEntry)._vptr_TypeEntry = (_func_int **)&PTR__FuncType_00220eb8;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->sig).result_type_names._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->sig).param_type_names._M_h);
  pTVar2 = (this->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2,(long)(this->sig).result_types.
                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)pTVar2);
  }
  pTVar2 = (this->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2,(long)(this->sig).param_types.
                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)pTVar2);
  }
  (this->super_TypeEntry)._vptr_TypeEntry = (_func_int **)&PTR__TypeEntry_00220f00;
  pcVar3 = (this->super_TypeEntry).name._M_dataplus._M_p;
  paVar1 = &(this->super_TypeEntry).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0xf0);
  return;
}

Assistant:

static bool classof(const TypeEntry* entry) {
    return entry->kind() == TypeEntryKind::Func;
  }